

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  cmMakefile *this;
  pointer pcVar1;
  cmLocalGenerator *this_00;
  bool bVar2;
  char *pcVar3;
  cmSourceFile *this_01;
  string *psVar4;
  cmListFileBacktrace *r;
  ostream *poVar5;
  long *plVar6;
  cmake *pcVar7;
  byte bVar8;
  pointer ppTVar9;
  size_type *psVar10;
  long lVar11;
  byte unaff_BL;
  string *sourceName;
  pointer pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  __hashtable *__h;
  bool bVar14;
  bool bVar15;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar16;
  string e;
  string fullPath;
  string local_260;
  cmLinkImplItem *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_208 [2];
  long local_1f8 [2];
  pointer local_1e8;
  cmGeneratorExpressionDAGChecker *local_1e0;
  string *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string usedSources;
  ios_base local_158 [264];
  cmListFileBacktrace local_50;
  
  ppTVar9 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  bVar14 = ppTVar9 == local_1e8;
  if (bVar14) {
    bVar8 = 0;
  }
  else {
    this = tgt->Target->Makefile;
    bVar8 = 0;
    local_1e0 = dagChecker;
    local_1d8 = config;
    local_1d0 = srcs;
    do {
      local_240 = (*ppTVar9)->LinkImplItem;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      e._M_string_length = 0;
      e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
      e._M_dataplus._M_p = (pointer)&e.field_2;
      pcVar3 = cmCompiledGeneratorExpression::Evaluate
                         (((*ppTVar9)->ge).x_,tgt->LocalGenerator,local_1d8,false,tgt,tgt,local_1e0,
                          &e);
      std::__cxx11::string::string((string *)&usedSources,pcVar3,(allocator *)&fullPath);
      cmSystemTools::ExpandListArgument(&usedSources,&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)e._M_dataplus._M_p != &e.field_2) {
        operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
      }
      if ((((*ppTVar9)->ge).x_)->HadContextSensitiveCondition != false) {
        bVar8 = 1;
      }
      bVar15 = entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      while (!bVar15) {
        this_01 = cmMakefile::GetOrCreateSource(this,sourceName,false);
        e._M_string_length = 0;
        e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
        e._M_dataplus._M_p = (pointer)&e.field_2;
        psVar4 = cmSourceFile::GetFullPath(this_01,&e);
        fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
        pcVar1 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fullPath,pcVar1,pcVar1 + psVar4->_M_string_length);
        if (fullPath._M_string_length == 0) {
          if (e._M_string_length != 0) {
            pcVar7 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
            r = cmTarget::GetBacktrace(tgt->Target);
            cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&usedSources,r);
            cmake::IssueMessage(pcVar7,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&usedSources);
          }
LAB_003917d9:
          bVar2 = false;
          unaff_BL = bVar8;
        }
        else {
          if (((local_240->super_cmLinkItem).super_string._M_string_length != 0) &&
             (bVar2 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p), !bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
            if ((local_240->super_cmLinkItem).super_string._M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&usedSources,
                         "Found relative path while evaluating sources of \"",0x31);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&usedSources,(tgt->Target->Name)._M_dataplus._M_p,
                                  (tgt->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  \"",6);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(sourceName->_M_dataplus)._M_p,sourceName->_M_string_length
                                 );
              lVar11 = 2;
              pcVar3 = "\"\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&usedSources,"Target \"",8);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&usedSources,
                                  (local_240->super_cmLinkItem).super_string._M_dataplus._M_p,
                                  (local_240->super_cmLinkItem).super_string._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(sourceName->_M_dataplus)._M_p,sourceName->_M_string_length
                                 );
              lVar11 = 1;
              pcVar3 = "\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar3,lVar11);
            this_00 = tgt->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
            std::ios_base::~ios_base(local_158);
            goto LAB_003917d9;
          }
          bVar2 = true;
          std::__cxx11::string::_M_assign((string *)sourceName);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)e._M_dataplus._M_p != &e.field_2) {
          operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
        }
        if (!bVar2) break;
        sourceName = sourceName + 1;
        bVar15 = sourceName ==
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      paVar13 = &e.field_2;
      if (!bVar15) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&entrySources);
        break;
      }
      local_240 = (cmLinkImplItem *)CONCAT71(local_240._1_7_,unaff_BL);
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      pbVar12 = entrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar1 = (pbVar12->_M_dataplus)._M_p;
          e._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&e,pcVar1,pcVar1 + pbVar12->_M_string_length);
          fullPath._M_dataplus._M_p = (pointer)uniqueSrcs;
          pVar16 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)uniqueSrcs,&e,&fullPath);
          if ((((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_1d0,&e), debugSources)) {
            std::operator+(&local_260," * ",&e);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
            fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar10) {
              fullPath.field_2._M_allocated_capacity = *psVar10;
              fullPath.field_2._8_8_ = plVar6[3];
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar10;
              fullPath._M_dataplus._M_p = (pointer)*plVar6;
            }
            fullPath._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&usedSources,(ulong)fullPath._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != paVar13) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 !=
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (usedSources._M_string_length != 0) {
        pcVar7 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"Used sources for target ","");
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_208,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_260.field_2._M_allocated_capacity = *psVar10;
          local_260.field_2._8_8_ = plVar6[3];
        }
        else {
          local_260.field_2._M_allocated_capacity = *psVar10;
          local_260._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_260._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          fullPath.field_2._M_allocated_capacity = *psVar10;
          fullPath.field_2._8_8_ = plVar6[3];
          fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
        }
        else {
          fullPath.field_2._M_allocated_capacity = *psVar10;
          fullPath._M_dataplus._M_p = (pointer)*plVar6;
        }
        fullPath._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&fullPath,(ulong)usedSources._M_dataplus._M_p);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          e.field_2._M_allocated_capacity = *psVar10;
          e.field_2._8_8_ = plVar6[3];
          e._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          e.field_2._M_allocated_capacity = *psVar10;
          e._M_dataplus._M_p = (pointer)*plVar6;
        }
        e._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cmListFileBacktrace::cmListFileBacktrace(&local_50,&(((*ppTVar9)->ge).x_)->Backtrace);
        cmake::IssueMessage(pcVar7,LOG,&e,&local_50);
        cmListFileBacktrace::~cmListFileBacktrace(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)e._M_dataplus._M_p != paVar13) {
          operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      ppTVar9 = ppTVar9 + 1;
      bVar14 = ppTVar9 == local_1e8;
      unaff_BL = (byte)local_240;
    } while (!bVar14);
  }
  if (bVar14) {
    unaff_BL = bVar8;
  }
  return (bool)(unaff_BL & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<std::string>& srcs, CM_UNORDERED_SET<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmGeneratorTarget::TargetPropertyEntry *>::const_iterator
         it = entries.begin(),
         end = entries.end();
       it != end; ++it) {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(
      (*it)->ge->Evaluate(tgt->GetLocalGenerator(), config, false, tgt, tgt,
                          dagChecker),
      entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::vector<std::string>::iterator i = entrySources.begin();
         i != entrySources.end(); ++i) {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str())) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative "
                 "path in its INTERFACE_SOURCES:\n"
                 "  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of "
                 "\""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::vector<std::string>::iterator li = entrySources.begin();
         li != entrySources.end(); ++li) {
      std::string src = *li;

      if (uniqueSrcs.insert(src).second) {
        srcs.push_back(src);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        cmake::LOG, std::string("Used sources for target ") + tgt->GetName() +
          ":\n" + usedSources,
        (*it)->ge->GetBacktrace());
    }
  }
  return contextDependent;
}